

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

Span * __thiscall QSpanCollection::spanAt(QSpanCollection *this,int x,int y)

{
  QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  Span *pSVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  long in_FS_OFFSET;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = -y;
  cVar2 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::lowerBound(&this->index,&local_2c);
  pQVar1 = (this->index).d.d.ptr;
  cVar5._M_node = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
                 *)0x0) {
    cVar5._M_node = (_Base_ptr)0x0;
  }
  if (cVar2.i._M_node != (const_iterator)cVar5._M_node) {
    local_2c = -x;
    cVar3 = QMap<int,_QSpanCollection::Span_*>::lowerBound
                      ((QMap<int,_QSpanCollection::Span_*> *)((long)cVar2.i._M_node + 0x28),
                       &local_2c);
    cVar6._M_node = (_Base_ptr)(*(long *)((long)cVar2.i._M_node + 0x28) + 0x10);
    if (*(long *)((long)cVar2.i._M_node + 0x28) == 0) {
      cVar6._M_node = (_Base_ptr)0x0;
    }
    if (((cVar3.i._M_node != (const_iterator)cVar6._M_node) &&
        (pSVar4 = *(Span **)((long)cVar3.i._M_node + 0x28), x <= pSVar4->m_right)) &&
       (y <= pSVar4->m_bottom)) goto LAB_00527087;
  }
  pSVar4 = (Span *)0x0;
LAB_00527087:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pSVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSpanCollection::Span *QSpanCollection::spanAt(int x, int y) const
{
    Index::const_iterator it_y = index.lowerBound(-y);
    if (it_y == index.end())
        return nullptr;
    SubIndex::const_iterator it_x = (*it_y).lowerBound(-x);
    if (it_x == (*it_y).end())
        return nullptr;
    Span *span = *it_x;
    if (span->right() >= x && span->bottom() >= y)
        return span;
    return nullptr;
}